

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_32bit(exr_decode_pipeline_t *decode)

{
  ushort uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint8_t *__dest;
  int c;
  ulong uVar8;
  void *__src;
  long lVar9;
  
  __src = decode->unpacked_buffer;
  uVar1 = decode->channel_count;
  lVar4 = 0;
  if ((short)uVar1 < 1) {
    uVar1 = 0;
  }
  for (; (ulong)uVar1 * 0x30 - lVar4 != 0; lVar4 = lVar4 + 0x30) {
    __src = (void *)((long)__src +
                    (long)(*(int *)((long)&decode->channels->width + lVar4) *
                           decode->user_line_begin_skip * 4));
  }
  lVar4 = (long)(decode->chunk).height -
          ((long)decode->user_line_end_ignore + (long)decode->user_line_begin_skip);
  lVar7 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar7;
  }
  for (; lVar7 != lVar4; lVar7 = lVar7 + 1) {
    for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
      peVar3 = decode->channels;
      lVar9 = (long)peVar3[uVar8].width;
      iVar2 = peVar3[uVar8].user_pixel_stride;
      __dest = peVar3[uVar8].field_12.decode_to_ptr + peVar3[uVar8].user_line_stride * lVar7;
      if ((long)iVar2 == 4) {
        memcpy(__dest,__src,lVar9 << 2);
      }
      else {
        lVar5 = 0;
        if (0 < lVar9) {
          lVar5 = lVar9;
        }
        for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
          *(undefined4 *)__dest = *(undefined4 *)((long)__src + lVar6 * 4);
          __dest = __dest + iVar2;
        }
      }
      __src = (void *)((long)__src + lVar9 * 4);
    }
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_32bit (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int64_t        w, h, pixincrement;
    int            chans = decode->channel_count;

    h = (int64_t) decode->chunk.height - decode->user_line_end_ignore;
    /*
     * if we have user_line_begin_skip, the user data pointer is at THAT
     * offset but our unpacked data is at y of '0' (well idx * height)
     */
    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);
        srcbuffer += decc->width * decode->user_line_begin_skip * 4;
    }
    h -= decode->user_line_begin_skip;

    for (int64_t y = 0; y < h; ++y)
    {
        for (int c = 0; c < chans; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata        = decc->decode_to_ptr;
            w            = decc->width;
            pixincrement = decc->user_pixel_stride;
            cdata += y * (int64_t) decc->user_line_stride;
            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
            if (pixincrement == 4)
            {
                uint32_t*       tmp = (uint32_t*) cdata;
                const uint32_t* src = (const uint32_t*) srcbuffer;
                uint32_t*       end = tmp + w;

                while (tmp < end)
                    *tmp++ = le32toh (*src++);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = le32toh (*src++);
                    cdata += pixincrement;
                }
            }
#else
            if (pixincrement == 4)
            {
                memcpy (cdata, srcbuffer, (size_t) (w) * 4);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = *src++;
                    cdata += pixincrement;
                }
            }
#endif
            srcbuffer += w * 4;
        }
    }
    return EXR_ERR_SUCCESS;
}